

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O2

aiNode * __thiscall
anon_unknown.dwarf_b3e6bd::ProcessSpatialStructure
          (anon_unknown_dwarf_b3e6bd *this,aiNode *parent,IfcProduct *el,ConversionData *conv,
          vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
          *collect_openings)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  long lVar2;
  Lazy *pLVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  pointer ppaVar27;
  pointer pcVar28;
  bool bVar29;
  IfcSpace *pIVar30;
  IfcAnnotation *pIVar31;
  aiNode *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar32;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var33;
  aiMetadata *this_02;
  _Base_ptr p_Var34;
  Lazy *pLVar35;
  IfcObjectPlacement *place;
  aiMatrix4x4 *paVar36;
  iterator iVar37;
  LazyObject *pLVar38;
  Object *pOVar39;
  IfcRelContainedInSpatialStructure *pIVar40;
  IfcSpatialStructureElement *pIVar41;
  aiNode *paVar42;
  IfcOpeningElement *pIVar43;
  IfcRelVoidsElement *pIVar44;
  IfcElement *pIVar45;
  __uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true> this_03;
  undefined8 *puVar46;
  aiMatrix4x4t<float> *this_04;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var47;
  IfcRelAggregates *pIVar48;
  IfcObjectDefinition *pIVar49;
  ulong uVar50;
  aiNode **ppaVar51;
  uint uVar52;
  pointer pTVar53;
  ulong __n;
  const_iterator it;
  TempOpening *op;
  pointer this_05;
  iterator __begin3;
  size_t __n_00;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> uVar54;
  pointer ppaVar55;
  iterator __end3;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar56;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> nd_aggr;
  allocator<char> local_5c1;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_5c0;
  vector<aiNode_*,_std::allocator<aiNode_*>_> subnodes;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> openings_local;
  IfcProject *local_568;
  aiScene *local_560;
  _Base_ptr local_558;
  aiNode *local_550;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> openings;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  string local_4e8;
  ConversionData *local_4c0;
  Metadata properties;
  aiNode *ndnew;
  pointer local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_428;
  _Base_ptr p_Stack_418;
  _Base_ptr local_410;
  pointer local_408;
  double dStack_400;
  double local_3f8;
  double dStack_3f0;
  aiScene *local_3e8;
  pointer local_3e0;
  double dStack_3d8;
  double local_3d0;
  double dStack_3c8;
  IfcProject *local_3c0;
  
  lVar2 = *(long *)&(el->super_IfcObject).field_0x18;
  local_4c0 = conv;
  if ((**(char **)&el[1].super_IfcObject.field_0x28 == '\x01') &&
     (pIVar30 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcSpace>
                          ((Object *)
                           ((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + -4))
     , pIVar30 != (IfcSpace *)0x0)) {
    Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x488cee);
    bVar11 = true;
  }
  else {
    bVar11 = false;
  }
  if ((*(char *)(*(long *)&el[1].super_IfcObject.field_0x28 + 2) == '\x01') &&
     (pIVar31 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcAnnotation>
                          ((Object *)
                           ((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + -4))
     , pIVar31 != (IfcAnnotation *)0x0)) {
    Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x488d2b);
    return (aiNode *)0x0;
  }
  this_01 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_01);
  Assimp::STEP::Object::GetClassName_abi_cxx11_
            (&local_4e8,
             (Object *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + -4));
  std::operator+(&local_528,&local_4e8,"_");
  if ((parent->mName).data[0x54] == '\x01') {
    pbVar32 = Assimp::STEP::
              Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Get((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((parent->mName).data + 0x34));
    std::__cxx11::string::string((string *)&openings,(string *)pbVar32);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&openings,"Unnamed",&local_5c1);
  }
  std::operator+(&local_508,&local_528,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&openings);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&properties,
                 &local_508,"_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ndnew,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&properties,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((parent->mName).data + 0xc));
  pcVar28 = local_430;
  if (local_430 < (pointer)0x400) {
    (this_01->mName).length = (ai_uint32)local_430;
    memcpy((this_01->mName).data,ndnew,(size_t)local_430);
    (this_01->mName).data[(long)pcVar28] = '\0';
  }
  local_5c0._M_node = (_Base_ptr)(lVar2 + 0xc0);
  std::__cxx11::string::~string((string *)&ndnew);
  std::__cxx11::string::~string((string *)&properties);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&openings);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_4e8);
  this_01->mParent = (aiNode *)this;
  this_00 = &el[1].super_IfcObject.field_0x40;
  ndnew = *(aiNode **)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::_M_insert_unique<unsigned_long>
            ((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              *)this_00,(unsigned_long *)&ndnew);
  _Var47._M_node = local_5c0._M_node;
  ndnew = *(aiNode **)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
  pVar56 = std::
           _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::equal_range((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                          *)local_5c0._M_node,(key_type_conflict1 *)&ndnew);
  _Var33 = pVar56.first._M_node;
  if (_Var33._M_node != (_Rb_tree_node_base *)(lVar2 + 200)) {
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &properties._M_t._M_impl.super__Rb_tree_header._M_header;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         properties._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    properties._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (_Var33._M_node == pVar56.second._M_node._M_node) {
      ProcessMetadata((uint64_t)_Var33._M_node[1]._M_parent,(ConversionData *)el,&properties);
    }
    else {
      for (; _Var33._M_node != pVar56.second._M_node._M_node;
          _Var33._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var33._M_node)) {
        ProcessMetadata((uint64_t)_Var33._M_node[1]._M_parent,(ConversionData *)el,&properties);
      }
    }
    if (properties._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      this_02 = aiMetadata::Alloc((uint)properties._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      uVar52 = 0;
      for (p_Var34 = properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var34 != &properties._M_t._M_impl.super__Rb_tree_header;
          p_Var34 = (_Base_ptr)std::_Rb_tree_increment(p_Var34)) {
        __n_00 = (ulong)p_Var34[2]._M_parent & 0xffffffff;
        if (((ulong)p_Var34[2]._M_parent & 0xfffffc00) != 0) {
          __n_00 = 0x3ff;
        }
        ndnew = (aiNode *)CONCAT44(ndnew._4_4_,(int)__n_00);
        memcpy((void *)((long)&ndnew + 4),*(void **)(p_Var34 + 2),__n_00);
        *(undefined1 *)((long)&ndnew + __n_00 + 4) = 0;
        aiMetadata::Set<aiString>(this_02,uVar52,(string *)(p_Var34 + 1),(aiString *)&ndnew);
        uVar52 = uVar52 + 1;
      }
      this_01->mMetaData = this_02;
      _Var47._M_node = local_5c0._M_node;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&properties._M_t);
  }
  if ((parent->mName).data[0xe4] == '\x01') {
    pLVar35 = (Lazy *)Assimp::STEP::
                      Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>::Get
                                ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>
                                  *)((parent->mName).data + 0xdc));
    place = Assimp::STEP::Lazy::operator_cast_to_IfcObjectPlacement_(pLVar35);
    ResolveObjectPlacement(&this_01->mTransformation,place,(ConversionData *)el);
  }
  openings.super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  openings.super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  openings.super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_508._M_dataplus._M_p = (pointer)0x0;
  local_508._M_string_length = 0;
  local_508.field_2._M_allocated_capacity = 0;
  local_508.field_2._8_8_ = 0;
  local_528._M_dataplus._M_p = (pointer)0x0;
  local_528._M_string_length = 0;
  local_528.field_2._M_allocated_capacity = 0;
  local_528.field_2._8_8_ = 0;
  local_4e8._M_dataplus._M_p = (pointer)0x0;
  local_4e8._M_string_length = 0;
  local_4e8.field_2._M_allocated_capacity = 0;
  local_4e8.field_2._8_8_ = 0;
  subnodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  subnodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  subnodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ndnew = *(aiNode **)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
  pVar56 = std::
           _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::equal_range((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                          *)_Var47._M_node,(key_type_conflict1 *)&ndnew);
  _Var47 = pVar56.first._M_node;
  puVar1 = &el[1].super_IfcObject.field_0x48;
  paVar36 = &this_01->mTransformation;
  bVar29 = false;
  local_558 = (_Base_ptr)0x3ff0000000000000;
  local_560 = (aiScene *)0x3ff0000000000000;
  local_550 = (aiNode *)0x3ff0000000000000;
  local_568 = (IfcProject *)0x3ff0000000000000;
  while( true ) {
    local_5c0 = pVar56.second._M_node;
    _Var33 = pVar56.first._M_node;
    if (_Var33._M_node == local_5c0._M_node) break;
    iVar37 = std::
             _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
             ::find((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)this_00,(key_type_conflict1 *)&_Var33._M_node[1]._M_parent);
    if (iVar37._M_node == (_Base_ptr)puVar1) {
      pLVar38 = Assimp::STEP::DB::MustGetObject
                          (*(DB **)&(el->super_IfcObject).field_0x18,
                           (uint64_t)_Var33._M_node[1]._M_parent);
      pOVar39 = Assimp::STEP::LazyObject::operator*(pLVar38);
      pIVar40 = Assimp::STEP::Object::
                ToPtr<Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure>(pOVar39);
      if (pIVar40 == (IfcRelContainedInSpatialStructure *)0x0) {
        pOVar39 = Assimp::STEP::LazyObject::operator*(pLVar38);
        pIVar44 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcRelVoidsElement>(pOVar39);
        if ((pIVar44 != (IfcRelVoidsElement *)0x0) &&
           (pIVar45 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcElement>::operator->
                                ((Lazy<Assimp::IFC::Schema_2x3::IfcElement> *)
                                 &(pIVar44->super_IfcRelConnects).field_0xb8),
           *(long *)(&(pIVar45->super_IfcProduct).super_IfcObject.field_0x8 +
                    *(long *)(*(long *)&(pIVar45->super_IfcProduct).super_IfcObject + -0x18)) ==
           *(long *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4))) {
          paVar42 = (aiNode *)
                    Assimp::STEP::Lazy::operator_cast_to_IfcFeatureElementSubtraction_
                              ((Lazy *)&pIVar44->RelatedOpeningElement);
          this_03.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
          super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
               (__uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>)operator_new(0x478);
          aiNode::aiNode((aiNode *)
                         this_03.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                         super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                         super__Head_base<0UL,_aiNode_*,_false>._M_head_impl);
          nd_aggr._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
          super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
               (__uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true>)
               (__uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true>)
               this_03.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
               super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
               super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
          aiString::Set((aiString *)
                        this_03.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                        super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                        super__Head_base<0UL,_aiNode_*,_false>._M_head_impl,"$RelVoidsElement");
          *(aiNode **)
           ((long)nd_aggr._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x448) = this_01;
          uVar4 = *(undefined8 *)&(this_01->mTransformation).a3;
          uVar5 = *(undefined8 *)&(this_01->mTransformation).b1;
          uVar6 = *(undefined8 *)&(this_01->mTransformation).b3;
          uVar7 = *(undefined8 *)&(this_01->mTransformation).c1;
          uVar8 = *(undefined8 *)&(this_01->mTransformation).c3;
          uVar9 = *(undefined8 *)&(this_01->mTransformation).d1;
          uVar10 = *(undefined8 *)&(this_01->mTransformation).d3;
          *(undefined8 *)
           ((long)nd_aggr._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x404) =
               *(undefined8 *)paVar36;
          *(undefined8 *)
           ((long)nd_aggr._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x40c) = uVar4;
          *(undefined8 *)
           ((long)nd_aggr._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x414) = uVar5;
          *(undefined8 *)
           ((long)nd_aggr._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x41c) = uVar6;
          *(undefined8 *)
           ((long)nd_aggr._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x424) = uVar7;
          *(undefined8 *)
           ((long)nd_aggr._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x42c) = uVar8;
          *(undefined8 *)
           ((long)nd_aggr._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x434) = uVar9;
          *(undefined8 *)
           ((long)nd_aggr._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x43c) = uVar10;
          openings_local.
          super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          openings_local.
          super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          openings_local.
          super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          paVar42 = ProcessSpatialStructure
                              ((anon_unknown_dwarf_b3e6bd *)
                               nd_aggr._M_t.
                               super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                               super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                               super__Head_base<0UL,_aiNode_*,_false>._M_head_impl,paVar42,el,
                               (ConversionData *)&openings_local,collect_openings);
          uVar54 = nd_aggr;
          if (paVar42 != (aiNode *)0x0) {
            *(undefined4 *)
             ((long)nd_aggr._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x450) = 1;
            puVar46 = (undefined8 *)operator_new__(8);
            *(undefined8 **)
             ((long)uVar54._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x458) = puVar46;
            *puVar46 = paVar42;
            if (openings_local.
                super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                openings_local.
                super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              pTVar53 = openings_local.
                        super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              this_05 = openings_local.
                        super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (!bVar29) {
                properties._M_t._M_impl._0_4_ = paVar36->a1;
                properties._M_t._M_impl._4_4_ = paVar36->a2;
                properties._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                     (_Rb_tree_color)(this_01->mTransformation).a3;
                properties._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
                     (this_01->mTransformation).a4;
                properties._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     *(_Base_ptr *)&(this_01->mTransformation).b1;
                properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     *(_Base_ptr *)&(this_01->mTransformation).b3;
                properties._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     *(_Base_ptr *)&(this_01->mTransformation).c1;
                properties._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
                     (this_01->mTransformation).c3;
                properties._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
                     (this_01->mTransformation).c4;
                this_04 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&properties);
                aiMatrix4x4t::operator_cast_to_aiMatrix4x4t(this_04);
                local_550 = ndnew;
                local_558 = local_410;
                local_508.field_2._M_allocated_capacity = aStack_428._8_8_;
                local_508.field_2._8_8_ = p_Stack_418;
                local_508._M_dataplus._M_p = local_430;
                local_508._M_string_length = aStack_428._M_allocated_capacity;
                local_528._M_dataplus._M_p = local_408;
                local_528._M_string_length = (size_type)dStack_400;
                local_528.field_2._M_allocated_capacity = (size_type)local_3f8;
                local_528.field_2._8_8_ = dStack_3f0;
                local_560 = local_3e8;
                local_4e8._M_dataplus._M_p = local_3e0;
                local_4e8._M_string_length = (size_type)dStack_3d8;
                local_4e8.field_2._M_allocated_capacity = (size_type)local_3d0;
                local_4e8.field_2._8_8_ = dStack_3c8;
                local_568 = local_3c0;
                pTVar53 = openings_local.
                          super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                this_05 = openings_local.
                          super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              for (; this_05 != pTVar53; this_05 = this_05 + 1) {
                aiMatrix4x4t::operator_cast_to_aiMatrix4x4t
                          ((aiMatrix4x4t<float> *)
                           (**(long **)((long)nd_aggr._M_t.
                                              super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                              .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl +
                                       0x458) + 0x404));
                ndnew = local_550;
                aStack_428._8_8_ = local_508.field_2._M_allocated_capacity;
                p_Stack_418 = (_Base_ptr)local_508.field_2._8_8_;
                local_430 = local_508._M_dataplus._M_p;
                aStack_428._M_allocated_capacity = local_508._M_string_length;
                local_410 = local_558;
                local_3f8 = (double)local_528.field_2._M_allocated_capacity;
                dStack_3f0 = (double)local_528.field_2._8_8_;
                local_408 = local_528._M_dataplus._M_p;
                dStack_400 = (double)local_528._M_string_length;
                local_3e8 = local_560;
                local_3d0 = (double)local_4e8.field_2._M_allocated_capacity;
                dStack_3c8 = (double)local_4e8.field_2._8_8_;
                local_3e0 = local_4e8._M_dataplus._M_p;
                dStack_3d8 = (double)local_4e8._M_string_length;
                local_3c0 = local_568;
                aiMatrix4x4t<double>::operator*=
                          ((aiMatrix4x4t<double> *)&ndnew,(aiMatrix4x4t<double> *)&properties);
                Assimp::IFC::TempOpening::Transform(this_05,(IfcMatrix4 *)&ndnew);
                std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
                push_back(&openings,this_05);
              }
              bVar29 = true;
              uVar54._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
              super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
              super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
                   nd_aggr._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                   super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                   super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
            }
            nd_aggr._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
            super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
            super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
                 (__uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true>)
                 (__uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>)0x0;
            ndnew = (aiNode *)
                    uVar54._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
            std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                      ((vector<aiNode*,std::allocator<aiNode*>> *)&subnodes,&ndnew);
          }
          std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::~vector
                    (&openings_local);
          std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr(&nd_aggr);
        }
      }
      else {
        pIVar41 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement>::
                  operator->(&pIVar40->RelatingStructure);
        if (*(long *)(&(pIVar41->super_IfcProduct).super_IfcObject.field_0x8 +
                     *(long *)(*(long *)&(pIVar41->super_IfcProduct).super_IfcObject + -0x18)) ==
            *(long *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4)) {
          pLVar3 = *(Lazy **)&pIVar40->field_0xc0;
          for (pLVar35 = *(Lazy **)&(pIVar40->super_IfcRelConnects).field_0xb8; pLVar35 != pLVar3;
              pLVar35 = pLVar35 + 8) {
            paVar42 = (aiNode *)Assimp::STEP::Lazy::operator_cast_to_IfcProduct_(pLVar35);
            pIVar43 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcOpeningElement>
                                ((Object *)
                                 ((paVar42->mName).data +
                                 *(long *)(*(long *)&paVar42->mName + -0x18) + -4));
            if ((pIVar43 == (IfcOpeningElement *)0x0) &&
               (ndnew = ProcessSpatialStructure
                                  ((anon_unknown_dwarf_b3e6bd *)this_01,paVar42,el,
                                   (ConversionData *)0x0,collect_openings), ndnew != (aiNode *)0x0))
            {
              std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back(&subnodes,&ndnew);
            }
          }
        }
      }
    }
    _Var33._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var33._M_node);
    pVar56.second._M_node = local_5c0._M_node;
    pVar56.first._M_node = _Var33._M_node;
  }
  for (; _Var47._M_node != local_5c0._M_node;
      _Var47._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var47._M_node)) {
    iVar37 = std::
             _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
             ::find((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)this_00,(key_type_conflict1 *)&_Var47._M_node[1]._M_parent);
    if (iVar37._M_node == (_Base_ptr)puVar1) {
      pLVar38 = Assimp::STEP::DB::GetObject
                          (*(DB **)&(el->super_IfcObject).field_0x18,
                           (uint64_t)_Var47._M_node[1]._M_parent);
      pIVar48 = Assimp::STEP::LazyObject::ToPtr<Assimp::IFC::Schema_2x3::IfcRelAggregates>(pLVar38);
      if ((pIVar48 != (IfcRelAggregates *)0x0) &&
         (pIVar49 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>::operator->
                              ((Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition> *)
                               &(pIVar48->super_IfcRelDecomposes).
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.
                                field_0x10),
         *(long *)((pIVar49->super_IfcRoot).
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper[-3]
                  + (long)&(pIVar49->super_IfcRoot).
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.aux_is_derived.
                           super__Base_bitset<1UL>) ==
         *(long *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4))) {
        paVar42 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar42);
        ndnew = paVar42;
        aiString::Set((aiString *)paVar42,"$RelAggregates");
        paVar42 = ndnew;
        ndnew->mParent = this_01;
        fVar12 = paVar36->a2;
        fVar13 = (this_01->mTransformation).a3;
        fVar14 = (this_01->mTransformation).a4;
        fVar15 = (this_01->mTransformation).b1;
        fVar16 = (this_01->mTransformation).b2;
        fVar17 = (this_01->mTransformation).b3;
        fVar18 = (this_01->mTransformation).b4;
        fVar19 = (this_01->mTransformation).c1;
        fVar20 = (this_01->mTransformation).c2;
        fVar21 = (this_01->mTransformation).c3;
        fVar22 = (this_01->mTransformation).c4;
        fVar23 = (this_01->mTransformation).d1;
        fVar24 = (this_01->mTransformation).d2;
        fVar25 = (this_01->mTransformation).d3;
        fVar26 = (this_01->mTransformation).d4;
        (ndnew->mTransformation).a1 = paVar36->a1;
        (ndnew->mTransformation).a2 = fVar12;
        (ndnew->mTransformation).a3 = fVar13;
        (ndnew->mTransformation).a4 = fVar14;
        (ndnew->mTransformation).b1 = fVar15;
        (ndnew->mTransformation).b2 = fVar16;
        (ndnew->mTransformation).b3 = fVar17;
        (ndnew->mTransformation).b4 = fVar18;
        (ndnew->mTransformation).c1 = fVar19;
        (ndnew->mTransformation).c2 = fVar20;
        (ndnew->mTransformation).c3 = fVar21;
        (ndnew->mTransformation).c4 = fVar22;
        (ndnew->mTransformation).d1 = fVar23;
        (ndnew->mTransformation).d2 = fVar24;
        (ndnew->mTransformation).d3 = fVar25;
        (ndnew->mTransformation).d4 = fVar26;
        uVar50 = *(long *)&(pIVar48->super_IfcRelDecomposes).
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.
                           field_0x20 -
                 *(long *)&(pIVar48->super_IfcRelDecomposes).
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.
                           field_0x18;
        if ((long)uVar50 < 0) {
          uVar50 = 0xffffffffffffffff;
        }
        ppaVar51 = (aiNode **)operator_new__(uVar50);
        memset(ppaVar51,0,uVar50);
        paVar42->mChildren = ppaVar51;
        pLVar3 = *(Lazy **)&(pIVar48->super_IfcRelDecomposes).
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.
                            field_0x20;
        for (pLVar35 = *(Lazy **)&(pIVar48->super_IfcRelDecomposes).
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>
                                  .field_0x18; paVar42 = ndnew, pLVar35 != pLVar3;
            pLVar35 = pLVar35 + 8) {
          pIVar49 = Assimp::STEP::Lazy::operator_cast_to_IfcObjectDefinition_(pLVar35);
          paVar42 = (aiNode *)
                    Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcProduct>
                              ((Object *)
                               ((long)&(pIVar49->super_IfcRoot).
                                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                       _vptr_ObjectHelper +
                               (long)(pIVar49->super_IfcRoot).
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                     _vptr_ObjectHelper[-3]));
          if ((paVar42 != (aiNode *)0x0) &&
             (paVar42 = ProcessSpatialStructure
                                  ((anon_unknown_dwarf_b3e6bd *)ndnew,paVar42,el,
                                   (ConversionData *)0x0,collect_openings), paVar42 != (aiNode *)0x0
             )) {
            uVar52 = ndnew->mNumChildren;
            ndnew->mNumChildren = uVar52 + 1;
            ndnew->mChildren[uVar52] = paVar42;
          }
        }
        ndnew = (aiNode *)0x0;
        properties._M_t._M_impl._0_8_ = paVar42;
        std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                  ((vector<aiNode*,std::allocator<aiNode*>> *)&subnodes,(aiNode **)&properties);
        std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr
                  ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&ndnew);
      }
    }
  }
  *(ConversionData **)&el[1].super_IfcObject.field_0x38 = local_4c0;
  if (local_4c0 == (ConversionData *)0x0) {
    *(vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> **)
     &el[1].super_IfcObject.field_0x30 = &openings;
  }
  if (!bVar11) {
    ProcessProductRepresentation
              ((anon_unknown_dwarf_b3e6bd *)parent,(IfcProduct *)this_01,(aiNode *)&subnodes,
               (vector<aiNode_*,_std::allocator<aiNode_*>_> *)el,(ConversionData *)collect_openings)
    ;
    *(undefined8 *)&el[1].super_IfcObject.field_0x30 = 0;
    *(undefined8 *)&el[1].super_IfcObject.field_0x38 = 0;
  }
  ppaVar27 = subnodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppaVar55 = subnodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar50 = (long)subnodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)subnodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar50 != 0) {
    __n = 0xffffffffffffffff;
    if (-1 < (long)uVar50) {
      __n = uVar50;
    }
    ppaVar51 = (aiNode **)operator_new__(__n);
    memset(ppaVar51,0,__n);
    this_01->mChildren = ppaVar51;
    for (; ppaVar55 != ppaVar27; ppaVar55 = ppaVar55 + 1) {
      paVar42 = *ppaVar55;
      uVar52 = this_01->mNumChildren;
      this_01->mNumChildren = uVar52 + 1;
      this_01->mChildren[uVar52] = paVar42;
      paVar42->mParent = this_01;
    }
  }
  ndnew = *(aiNode **)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
  iVar37 = std::
           _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
           ::find((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)this_00,(key_type_conflict1 *)&ndnew);
  if (iVar37._M_node != (_Base_ptr)puVar1) {
    ndnew = *(aiNode **)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
    iVar37 = std::
             _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
             ::find((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)this_00,(key_type_conflict1 *)&ndnew);
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                        *)this_00,(const_iterator)iVar37._M_node);
    std::_Vector_base<aiNode_*,_std::allocator<aiNode_*>_>::~_Vector_base
              (&subnodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>);
    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::~vector
              (&openings);
    return this_01;
  }
  __assert_fail("conv.already_processed.find(el.GetID()) != conv.already_processed.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCLoader.cpp"
                ,0x365,
                "aiNode *(anonymous namespace)::ProcessSpatialStructure(aiNode *, const Schema_2x3::IfcProduct &, ConversionData &, std::vector<TempOpening> *)"
               );
}

Assistant:

aiNode* ProcessSpatialStructure(aiNode* parent, const Schema_2x3::IfcProduct& el, ConversionData& conv,
        std::vector<TempOpening>* collect_openings = nullptr ) {
    const STEP::DB::RefMap& refs = conv.db.GetRefs();

    // skip over space and annotation nodes - usually, these have no meaning in Assimp's context
    bool skipGeometry = false;
    if(conv.settings.skipSpaceRepresentations) {
        if(el.ToPtr<Schema_2x3::IfcSpace>()) {
            IFCImporter::LogDebug("skipping IfcSpace entity due to importer settings");
            skipGeometry = true;
        }
    }

    if(conv.settings.skipAnnotations) {
        if(el.ToPtr<Schema_2x3::IfcAnnotation>()) {
            IFCImporter::LogDebug("skipping IfcAnnotation entity due to importer settings");
            return nullptr;
        }
    }

    // add an output node for this spatial structure
    aiNode *nd(new aiNode );
    nd->mName.Set(el.GetClassName()+"_"+(el.Name?el.Name.Get():"Unnamed")+"_"+el.GlobalId);
    nd->mParent = parent;

    conv.already_processed.insert(el.GetID());

    // check for node metadata
    STEP::DB::RefMapRange children = refs.equal_range(el.GetID());
    if (children.first!=refs.end()) {
        Metadata properties;
        if (children.first==children.second) {
            // handles single property set
            ProcessMetadata((*children.first).second, conv, properties);
        } else {
            // handles multiple property sets (currently all property sets are merged,
            // which may not be the best solution in the long run)
            for (STEP::DB::RefMap::const_iterator it=children.first; it!=children.second; ++it) {
                ProcessMetadata((*it).second, conv, properties);
            }
        }

        if (!properties.empty()) {
            aiMetadata* data = aiMetadata::Alloc( static_cast<unsigned int>(properties.size()) );
            unsigned int index( 0 );
            for ( const Metadata::value_type& kv : properties ) {
                data->Set( index++, kv.first, aiString( kv.second ) );
            }
            nd->mMetaData = data;
        }
    }

    if(el.ObjectPlacement) {
        ResolveObjectPlacement(nd->mTransformation,el.ObjectPlacement.Get(),conv);
    }

    std::vector<TempOpening> openings;

    IfcMatrix4 myInv;
    bool didinv = false;

    // convert everything contained directly within this structure,
    // this may result in more nodes.
    std::vector< aiNode* > subnodes;
    try {
        // locate aggregates and 'contained-in-here'-elements of this spatial structure and add them in recursively
        // on our way, collect openings in *this* element
        STEP::DB::RefMapRange range = refs.equal_range(el.GetID());

        for(STEP::DB::RefMapRange range2 = range; range2.first != range.second; ++range2.first) {
            // skip over meshes that have already been processed before. This is strictly necessary
            // because the reverse indices also include references contained in argument lists and
            // therefore every element has a back-reference hold by its parent.
            if (conv.already_processed.find((*range2.first).second) != conv.already_processed.end()) {
                continue;
            }
            const STEP::LazyObject& obj = conv.db.MustGetObject((*range2.first).second);

            // handle regularly-contained elements
            if(const Schema_2x3::IfcRelContainedInSpatialStructure* const cont = obj->ToPtr<Schema_2x3::IfcRelContainedInSpatialStructure>()) {
                if(cont->RelatingStructure->GetID() != el.GetID()) {
                    continue;
                }
                for(const Schema_2x3::IfcProduct& pro : cont->RelatedElements) {
                    if(pro.ToPtr<Schema_2x3::IfcOpeningElement>()) {
                        // IfcOpeningElement is handled below. Sadly we can't use it here as is:
                        // The docs say that opening elements are USUALLY attached to building storey,
                        // but we want them for the building elements to which they belong.
                        continue;
                    }

                    aiNode* const ndnew = ProcessSpatialStructure(nd,pro,conv,nullptr);
                    if(ndnew) {
                        subnodes.push_back( ndnew );
                    }
                }
            }
            // handle openings, which we collect in a list rather than adding them to the node graph
            else if(const Schema_2x3::IfcRelVoidsElement* const fills = obj->ToPtr<Schema_2x3::IfcRelVoidsElement>()) {
                if(fills->RelatingBuildingElement->GetID() == el.GetID()) {
                    const Schema_2x3::IfcFeatureElementSubtraction& open = fills->RelatedOpeningElement;

                    // move opening elements to a separate node since they are semantically different than elements that are just 'contained'
                    std::unique_ptr<aiNode> nd_aggr(new aiNode());
                    nd_aggr->mName.Set("$RelVoidsElement");
                    nd_aggr->mParent = nd;

                    nd_aggr->mTransformation = nd->mTransformation;

                    std::vector<TempOpening> openings_local;
                    aiNode* const ndnew = ProcessSpatialStructure( nd_aggr.get(),open, conv,&openings_local);
                    if (ndnew) {

                        nd_aggr->mNumChildren = 1;
                        nd_aggr->mChildren = new aiNode*[1]();


                        nd_aggr->mChildren[0] = ndnew;

                        if(openings_local.size()) {
                            if (!didinv) {
                                myInv = aiMatrix4x4(nd->mTransformation ).Inverse();
                                didinv = true;
                            }

                            // we need all openings to be in the local space of *this* node, so transform them
                            for(TempOpening& op :openings_local) {
                                op.Transform( myInv*nd_aggr->mChildren[0]->mTransformation);
                                openings.push_back(op);
                            }
                        }
                        subnodes.push_back( nd_aggr.release() );
                    }
                }
            }
        }

        for(;range.first != range.second; ++range.first) {
            // see note in loop above
            if (conv.already_processed.find((*range.first).second) != conv.already_processed.end()) {
                continue;
            }
            if(const Schema_2x3::IfcRelAggregates* const aggr = conv.db.GetObject((*range.first).second)->ToPtr<Schema_2x3::IfcRelAggregates>()) {
                if(aggr->RelatingObject->GetID() != el.GetID()) {
                    continue;
                }

                // move aggregate elements to a separate node since they are semantically different than elements that are just 'contained'
                std::unique_ptr<aiNode> nd_aggr(new aiNode());
                nd_aggr->mName.Set("$RelAggregates");
                nd_aggr->mParent = nd;

                nd_aggr->mTransformation = nd->mTransformation;

                nd_aggr->mChildren = new aiNode*[aggr->RelatedObjects.size()]();
                for(const Schema_2x3::IfcObjectDefinition& def : aggr->RelatedObjects) {
                    if(const Schema_2x3::IfcProduct* const prod = def.ToPtr<Schema_2x3::IfcProduct>()) {

                        aiNode* const ndnew = ProcessSpatialStructure(nd_aggr.get(),*prod,conv,NULL);
                        if(ndnew) {
                            nd_aggr->mChildren[nd_aggr->mNumChildren++] = ndnew;
                        }
                    }
                }

                subnodes.push_back( nd_aggr.release() );
            }
        }

        conv.collect_openings = collect_openings;
        if(!conv.collect_openings) {
            conv.apply_openings = &openings;
        }

        if (!skipGeometry) {
          ProcessProductRepresentation(el, nd, subnodes, conv);
          conv.apply_openings = conv.collect_openings = nullptr;
        }

        if (subnodes.size()) {
            nd->mChildren = new aiNode*[subnodes.size()]();
            for(aiNode* nd2 : subnodes) {
                nd->mChildren[nd->mNumChildren++] = nd2;
                nd2->mParent = nd;
            }
        }
    } catch(...) {
        // it hurts, but I don't want to pull boost::ptr_vector into -noboost only for these few spots here
        std::for_each(subnodes.begin(),subnodes.end(),delete_fun<aiNode>());
        throw;
    }

    ai_assert(conv.already_processed.find(el.GetID()) != conv.already_processed.end());
    conv.already_processed.erase(conv.already_processed.find(el.GetID()));
    return nd;
}